

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<henson::PythonPuppet>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/puppet.cpp:58:30)>
::do_call(Proxy_Function_Callable_Impl<std::shared_ptr<henson::PythonPuppet>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap_*),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_puppet_cpp:58:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  pointer pBVar1;
  Type_Conversions_State *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar3;
  Boxed_Value BVar4;
  CommandLine cmd_line;
  undefined1 local_d1;
  shared_ptr<henson::PythonPuppet> local_d0;
  Result_Type local_c0;
  string local_b8;
  Result_Type local_98;
  string local_78;
  CommandLine local_58;
  NameMap *local_28;
  
  boxed_cast<std::__cxx11::string>
            (&local_98,(chaiscript *)(t_conversions->m_conversions)._M_data,(Boxed_Value *)in_RCX,
             in_RCX);
  local_c0 = boxed_cast<henson::ProcMap*>
                       ((Boxed_Value *)
                        ((long)&(((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.
                                super___mutex_base._M_mutex + 0x10),in_RCX);
  henson::CommandLine::CommandLine(&local_58,&local_98);
  pBVar1 = params[2].
           super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pBVar1,
             (long)&((params[2].
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->m_data).
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + (long)pBVar1);
  henson::CommandLine::executable(&local_78,&local_58,&local_b8);
  local_28 = (NameMap *)
             params[1].
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0.super___shared_ptr<henson::PythonPuppet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<henson::PythonPuppet,std::allocator<henson::PythonPuppet>,std::__cxx11::string,std::vector<char*,std::allocator<char*>>&,henson::ProcMap*&,henson::NameMap*>
            (&local_d0.super___shared_ptr<henson::PythonPuppet,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(PythonPuppet **)&local_d0,(allocator<henson::PythonPuppet> *)&local_d1,
             &local_78,&local_58.argv,&local_c0,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_58.argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_58.arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  sVar3 = Boxed_Value::Object_Data::get<henson::PythonPuppet>((Object_Data *)this,&local_d0,true);
  _Var2 = sVar3.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_d0.super___shared_ptr<henson::PythonPuppet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<henson::PythonPuppet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }